

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

Type __thiscall capnp::SchemaLoader::getType(SchemaLoader *this,Reader proto,Schema scope)

{
  ushort uVar1;
  short sVar2;
  Reader proto_00;
  Reader brand;
  Reader brand_00;
  Reader brand_01;
  ulong uVar3;
  undefined8 uVar4;
  anon_union_8_2_eba6ea51_for_Type_5 aVar5;
  ulong uVar6;
  uint index;
  byte bVar7;
  ulong uVar8;
  uint64_t uVar9;
  bool bVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  Type TVar13;
  Type TVar14;
  Schema local_120;
  PointerReader local_118;
  StructReader local_f0;
  StructReader local_c0;
  StructReader local_90;
  StructReader local_60;
  
  if (proto._reader.dataSize < 0x10) {
    uVar3 = 0;
  }
  else {
    uVar1 = *proto._reader.data;
    uVar3 = (ulong)uVar1;
    if (0xd < uVar1) {
      local_120.raw = scope.raw;
      switch(uVar1) {
      case 0xe:
        bVar10 = proto._reader.pointerCount == 0;
        local_118.pointer = proto._reader.pointers;
        if (bVar10) {
          local_118.pointer = (WirePointer *)0x0;
        }
        local_118.nestingLimit = 0x7fffffff;
        if (!bVar10) {
          local_118.nestingLimit = proto._reader.nestingLimit;
        }
        uVar11 = 0;
        uVar12 = 0;
        local_118.capTable._0_4_ = 0;
        local_118.capTable._4_4_ = 0;
        if (!bVar10) {
          uVar11 = proto._reader.segment._0_4_;
          uVar12 = proto._reader.segment._4_4_;
          local_118.capTable._0_4_ = proto._reader.capTable._0_4_;
          local_118.capTable._4_4_ = proto._reader.capTable._4_4_;
        }
        local_118.segment = (SegmentReader *)CONCAT44(uVar12,uVar11);
        _::PointerReader::getStruct(&local_f0,&local_118,(word *)0x0);
        proto_00._reader.capTable = local_f0.capTable;
        proto_00._reader.segment = local_f0.segment;
        proto_00._reader.data = local_f0.data;
        proto_00._reader.pointers = local_f0.pointers;
        proto_00._reader.dataSize = local_f0.dataSize;
        proto_00._reader.pointerCount = local_f0.pointerCount;
        proto_00._reader._38_2_ = local_f0._38_2_;
        proto_00._reader.nestingLimit = local_f0.nestingLimit;
        proto_00._reader._44_4_ = local_f0._44_4_;
        TVar14 = getType(this,proto_00,scope);
        uVar6 = TVar14._0_8_;
        bVar7 = TVar14.listDepth + 1;
LAB_0013c3a6:
        uVar6 = uVar6 & 0xffff000000000000;
        uVar8 = TVar14._0_8_;
        goto LAB_0013c2cf;
      case 0xf:
        if (proto._reader.dataSize < 0x80) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
        }
        if (proto._reader.pointerCount == 0) {
          proto._reader.nestingLimit = 0x7fffffff;
          proto._reader.segment._0_4_ = 0;
          proto._reader.segment._4_4_ = 0;
          proto._reader.capTable._0_4_ = 0;
          proto._reader.capTable._4_4_ = 0;
          proto._reader.pointers = (WirePointer *)0x0;
        }
        local_118.segment =
             (SegmentReader *)CONCAT44(proto._reader.segment._4_4_,proto._reader.segment._0_4_);
        local_118.capTable._0_4_ = proto._reader.capTable._0_4_;
        local_118.capTable._4_4_ = proto._reader.capTable._4_4_;
        local_118.pointer = proto._reader.pointers;
        local_118.nestingLimit = proto._reader.nestingLimit;
        _::PointerReader::getStruct(&local_90,&local_118,(word *)0x0);
        brand_01._reader.capTable = local_90.capTable;
        brand_01._reader.segment = local_90.segment;
        brand_01._reader.data = local_90.data;
        brand_01._reader.pointers = local_90.pointers;
        brand_01._reader.dataSize = local_90.dataSize;
        brand_01._reader.pointerCount = local_90.pointerCount;
        brand_01._reader._38_2_ = local_90._38_2_;
        brand_01._reader.nestingLimit = local_90.nestingLimit;
        brand_01._reader._44_4_ = local_90._44_4_;
        local_118.segment = (SegmentReader *)get(this,uVar9,brand_01,scope);
        aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asEnum((Schema *)&local_118);
        uVar4 = 0xf;
        break;
      case 0x10:
        if (proto._reader.dataSize < 0x80) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
        }
        if (proto._reader.pointerCount == 0) {
          proto._reader.nestingLimit = 0x7fffffff;
          proto._reader.segment._0_4_ = 0;
          proto._reader.segment._4_4_ = 0;
          proto._reader.capTable._0_4_ = 0;
          proto._reader.capTable._4_4_ = 0;
          proto._reader.pointers = (WirePointer *)0x0;
        }
        local_118.segment =
             (SegmentReader *)CONCAT44(proto._reader.segment._4_4_,proto._reader.segment._0_4_);
        local_118.capTable._0_4_ = proto._reader.capTable._0_4_;
        local_118.capTable._4_4_ = proto._reader.capTable._4_4_;
        local_118.pointer = proto._reader.pointers;
        local_118.nestingLimit = proto._reader.nestingLimit;
        _::PointerReader::getStruct(&local_60,&local_118,(word *)0x0);
        brand._reader.capTable = local_60.capTable;
        brand._reader.segment = local_60.segment;
        brand._reader.data = local_60.data;
        brand._reader.pointers = local_60.pointers;
        brand._reader.dataSize = local_60.dataSize;
        brand._reader.pointerCount = local_60.pointerCount;
        brand._reader._38_2_ = local_60._38_2_;
        brand._reader.nestingLimit = local_60.nestingLimit;
        brand._reader._44_4_ = local_60._44_4_;
        local_118.segment = (SegmentReader *)get(this,uVar9,brand,scope);
        aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asStruct((Schema *)&local_118);
        uVar4 = 0x10;
        break;
      case 0x11:
        if (proto._reader.dataSize < 0x80) {
          uVar9 = 0;
        }
        else {
          uVar9 = *(uint64_t *)((long)proto._reader.data + 8);
        }
        if (proto._reader.pointerCount == 0) {
          proto._reader.nestingLimit = 0x7fffffff;
          proto._reader.segment._0_4_ = 0;
          proto._reader.segment._4_4_ = 0;
          proto._reader.capTable._0_4_ = 0;
          proto._reader.capTable._4_4_ = 0;
          proto._reader.pointers = (WirePointer *)0x0;
        }
        local_118.segment =
             (SegmentReader *)CONCAT44(proto._reader.segment._4_4_,proto._reader.segment._0_4_);
        local_118.capTable._0_4_ = proto._reader.capTable._0_4_;
        local_118.capTable._4_4_ = proto._reader.capTable._4_4_;
        local_118.pointer = proto._reader.pointers;
        local_118.nestingLimit = proto._reader.nestingLimit;
        _::PointerReader::getStruct(&local_c0,&local_118,(word *)0x0);
        brand_00._reader.capTable = local_c0.capTable;
        brand_00._reader.segment = local_c0.segment;
        brand_00._reader.data = local_c0.data;
        brand_00._reader.pointers = local_c0.pointers;
        brand_00._reader.dataSize = local_c0.dataSize;
        brand_00._reader.pointerCount = local_c0.pointerCount;
        brand_00._reader._38_2_ = local_c0._38_2_;
        brand_00._reader.nestingLimit = local_c0.nestingLimit;
        brand_00._reader._44_4_ = local_c0._44_4_;
        local_118.segment = (SegmentReader *)get(this,uVar9,brand_00,scope);
        aVar5 = (anon_union_8_2_eba6ea51_for_Type_5)Schema::asInterface((Schema *)&local_118);
        uVar4 = 0x11;
        break;
      case 0x12:
        uVar3 = 0x12;
        if (0x4f < proto._reader.dataSize) {
          sVar2 = *(short *)((long)proto._reader.data + 8);
          bVar7 = 0;
          if (sVar2 != 0) {
            uVar8 = 0;
            uVar6 = 0;
            TVar14 = (Type)ZEXT816(0x12);
            if (sVar2 == 2) goto LAB_0013c2cf;
            if (sVar2 != 1) goto switchD_0013c328_default;
            if (proto._reader.dataSize < 0xc0) {
              uVar9 = 0;
              index = 0;
              if (0x5f < proto._reader.dataSize) goto LAB_0013c616;
            }
            else {
              uVar9 = *(uint64_t *)((long)proto._reader.data + 0x10);
LAB_0013c616:
              index = (uint)*(ushort *)((long)proto._reader.data + 10);
            }
            TVar14 = Schema::getBrandBinding(&local_120,uVar9,index);
            uVar6 = TVar14._0_8_;
            bVar7 = TVar14.listDepth;
            goto LAB_0013c3a6;
          }
        }
        goto LAB_0013c2c9;
      default:
switchD_0013c328_default:
        kj::_::unreachable();
      }
      TVar14.field_4.schema = aVar5.schema;
      TVar14.baseType = (short)uVar4;
      TVar14.listDepth = (char)((ulong)uVar4 >> 0x10);
      TVar14.isImplicitParam = (bool)(char)((ulong)uVar4 >> 0x18);
      TVar14.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)((ulong)uVar4 >> 0x20);
      TVar14._6_2_ = (short)((ulong)uVar4 >> 0x30);
      bVar7 = 0;
      uVar8 = 0;
      uVar6 = 0;
      goto LAB_0013c2cf;
    }
  }
LAB_0013c2c9:
  bVar7 = 0;
  uVar8 = 0;
  uVar6 = 0;
  TVar14.field_4.schema = (RawBrandedSchema *)0x0;
  TVar14.baseType = (short)uVar3;
  TVar14.listDepth = (char)(uVar3 >> 0x10);
  TVar14.isImplicitParam = (bool)(char)(uVar3 >> 0x18);
  TVar14.field_3 = (anon_union_2_2_d12d5221_for_Type_3)(short)(uVar3 >> 0x20);
  TVar14._6_2_ = (short)(uVar3 >> 0x30);
LAB_0013c2cf:
  TVar13.field_4 = TVar14.field_4;
  TVar13._0_8_ = TVar14._0_8_ & 0xffff | (ulong)((uint)uVar8 & 0xff000000) | (ulong)bVar7 << 0x10 |
                 uVar8 & 0xffff00000000 | uVar6;
  return TVar13;
}

Assistant:

Type SchemaLoader::getType(schema::Type::Reader proto, Schema scope) const {
  switch (proto.which()) {
    case schema::Type::VOID:
    case schema::Type::BOOL:
    case schema::Type::INT8:
    case schema::Type::INT16:
    case schema::Type::INT32:
    case schema::Type::INT64:
    case schema::Type::UINT8:
    case schema::Type::UINT16:
    case schema::Type::UINT32:
    case schema::Type::UINT64:
    case schema::Type::FLOAT32:
    case schema::Type::FLOAT64:
    case schema::Type::TEXT:
    case schema::Type::DATA:
      return proto.which();

    case schema::Type::STRUCT: {
      auto structType = proto.getStruct();
      return get(structType.getTypeId(), structType.getBrand(), scope).asStruct();
    }

    case schema::Type::ENUM: {
      auto enumType = proto.getEnum();
      return get(enumType.getTypeId(), enumType.getBrand(), scope).asEnum();
    }

    case schema::Type::INTERFACE: {
      auto interfaceType = proto.getInterface();
      return get(interfaceType.getTypeId(), interfaceType.getBrand(), scope)
          .asInterface();
    }

    case schema::Type::LIST:
      return ListSchema::of(getType(proto.getList().getElementType(), scope));

    case schema::Type::ANY_POINTER: {
      auto anyPointer = proto.getAnyPointer();
      switch (anyPointer.which()) {
        case schema::Type::AnyPointer::UNCONSTRAINED:
          return schema::Type::ANY_POINTER;
        case schema::Type::AnyPointer::PARAMETER: {
          auto param = anyPointer.getParameter();
          return scope.getBrandBinding(param.getScopeId(), param.getParameterIndex());
        }
        case schema::Type::AnyPointer::IMPLICIT_METHOD_PARAMETER:
          // We don't support binding implicit method params here.
          return schema::Type::ANY_POINTER;
      }

      KJ_UNREACHABLE;
    }
  }

  KJ_UNREACHABLE;
}